

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::getInputs
          (ShaderAtomicExchangeCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  int local_34;
  int localNdx;
  int groupOffset;
  int groupNdx;
  int numWorkGroups;
  int workGroupSize;
  void *inputs_local;
  int stride_local;
  int numValues_local;
  ShaderAtomicExchangeCase *this_local;
  
  uVar1 = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  for (localNdx = 0; localNdx < numValues / (int)uVar1; localNdx = localNdx + 1) {
    for (local_34 = 0; local_34 < (int)uVar1; local_34 = local_34 + 1) {
      *(int *)((long)inputs + (long)(int)(stride * (localNdx * uVar1 + local_34))) = local_34 + 1;
    }
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(int*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = localNdx+1;
		}
	}